

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O3

ostream * AixLog::operator<<(ostream *os,TextColor *text_color)

{
  Color CVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"\x1b[",2);
  CVar1 = text_color->foreground;
  if (text_color->background == NONE && CVar1 == NONE) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"0",1);
    CVar1 = text_color->foreground;
  }
  if (CVar1 != NONE) {
    std::ostream::operator<<(os,CVar1 + 0x1d);
    if (text_color->background == NONE) goto LAB_00116c93;
    std::__ostream_insert<char,std::char_traits<char>>(os,";",1);
  }
  if (text_color->background != NONE) {
    std::ostream::operator<<(os,text_color->background + 0x27);
  }
LAB_00116c93:
  std::__ostream_insert<char,std::char_traits<char>>(os,"m",1);
  return os;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const TextColor& text_color) {
  os << "\033[";
  if ((text_color.foreground == Color::none) &&
      (text_color.background == Color::none))
    os << "0";  // reset colors if no params

  if (text_color.foreground != Color::none) {
    os << 29 + static_cast<int>(text_color.foreground);
    if (text_color.background != Color::none) os << ";";
  }
  if (text_color.background != Color::none)
    os << 39 + static_cast<int>(text_color.background);
  os << "m";

  return os;
}